

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

KFIXED8_3 * __thiscall KDIS::DATA_TYPE::LE_EulerAngles::operator[](LE_EulerAngles *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  LE_EulerAngles *pLStack_18;
  KUINT16 i_local;
  LE_EulerAngles *this_local;
  
  if (i == 0) {
    this_local = (LE_EulerAngles *)&this->m_Psi;
  }
  else if (i == 1) {
    this_local = (LE_EulerAngles *)&this->m_Theta;
  }
  else {
    if (i != 2) {
      local_1a = i;
      pLStack_18 = this;
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"operator[]",&local_41)
      ;
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    this_local = (LE_EulerAngles *)&this->m_Phi;
  }
  return (KFIXED8_3 *)this_local;
}

Assistant:

const KFIXED8_3 &LE_EulerAngles::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_Psi;
    case 1:
        return m_Theta;
    case 2:
        return m_Phi;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}